

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::peers_erased
          (torrent *this,
          vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          *peers)

{
  torrent_peer *peer;
  bool bVar1;
  reference pptVar2;
  pointer this_00;
  torrent_peer *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  *__range2;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  *peers_local;
  torrent *this_local;
  
  bVar1 = has_picker(this);
  if (bVar1) {
    __end2 = ::std::
             vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ::begin(peers);
    p = (torrent_peer *)
        ::std::
        vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        end(peers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                                       *)&p), bVar1) {
      pptVar2 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                ::operator*(&__end2);
      peer = *pptVar2;
      this_00 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      piece_picker::clear_peer(this_00,peer);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void torrent::peers_erased(std::vector<torrent_peer*> const& peers)
	{
		if (!has_picker()) return;

		for (auto* const p : peers)
		{
			m_picker->clear_peer(p);
		}
#if TORRENT_USE_INVARIANT_CHECKS
		m_picker->check_peers();
#endif
	}